

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_q6_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  size_t sVar13;
  long lVar14;
  void *pvVar15;
  float *pfVar16;
  long lVar17;
  bool bVar18;
  ushort uVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  long lVar23;
  long lVar24;
  float *in_R9;
  int ib;
  long lVar25;
  long lVar26;
  long lVar27;
  int8_t *piVar28;
  float fVar29;
  undefined1 extraout_var [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  short sVar32;
  anon_union_4_2_5fd15f10 fp32;
  uint uVar33;
  uint uVar37;
  float fVar38;
  uint uVar39;
  float fVar40;
  uint uVar41;
  undefined1 auVar36 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [16];
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  int64_t nb;
  float scales [16];
  int8_t L [256];
  long local_1e8;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  float afStack_178 [16];
  int8_t local_138 [32];
  undefined1 auStack_118 [32];
  undefined1 auStack_f8 [32];
  undefined1 local_d8 [168];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar34;
  undefined6 uVar35;
  
  sVar13 = ggml_row_size(GGML_TYPE_Q6_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q6_K_ref(src,(block_q6_K *)dst,n_per_row * nrow);
  }
  else if (0 < nrow) {
    lVar14 = n_per_row + 0xff;
    if (-1 < n_per_row) {
      lVar14 = n_per_row;
    }
    local_1e8 = (long)dst + 0xc0;
    lVar17 = 0;
    do {
      if (0xff < n_per_row) {
        lVar26 = 0;
        pfVar20 = src;
        pfVar21 = quant_weights;
        lVar27 = local_1e8;
        do {
          auVar43 = ZEXT816(0);
          piVar28 = local_138;
          lVar25 = 0;
          pfVar16 = pfVar20;
          pfVar22 = pfVar21;
          auVar49 = ZEXT816(0);
          do {
            fVar29 = make_qx_quants(0x10,0x20,pfVar16,piVar28,(int)pfVar22,in_R9);
            afStack_178[lVar25] = fVar29;
            fVar42 = (float)((uint)fVar29 & (uint)DAT_0014a020);
            auVar45._4_4_ = extraout_var._0_4_ & DAT_0014a020._4_4_;
            auVar45._0_4_ = fVar42;
            auVar45._8_4_ = extraout_var._4_4_ & DAT_0014a020._8_4_;
            auVar45._12_4_ = extraout_var._8_4_ & DAT_0014a020._12_4_;
            fVar51 = auVar49._0_4_;
            if (fVar42 <= fVar51) {
              auVar45._0_4_ = fVar51;
            }
            auVar30._0_4_ = (uint)fVar29 & -(uint)(fVar51 < fVar42);
            auVar30._4_4_ = extraout_var._0_4_ & auVar49._4_4_;
            auVar30._8_4_ = extraout_var._4_4_ & auVar49._8_4_;
            auVar30._12_4_ = extraout_var._8_4_ & auVar49._12_4_;
            local_198 = auVar43._0_4_;
            uStack_194 = auVar43._4_4_;
            uStack_190 = auVar43._8_4_;
            uStack_18c = auVar43._12_4_;
            auVar43._0_4_ = ~-(uint)(fVar51 < fVar42) & local_198;
            auVar43._4_4_ = ~auVar49._4_4_ & uStack_194;
            auVar43._8_4_ = ~auVar49._8_4_ & uStack_190;
            auVar43._12_4_ = ~auVar49._12_4_ & uStack_18c;
            auVar43 = auVar43 | auVar30;
            lVar25 = lVar25 + 1;
            piVar28 = piVar28 + 0x10;
            pfVar16 = pfVar16 + 0x10;
            pfVar22 = pfVar22 + 0x10;
            auVar49 = auVar45;
          } while (lVar25 != 0x10);
          if (1e-15 <= auVar45._0_4_) {
            fVar42 = -128.0 / auVar43._0_4_;
            fVar51 = 1.0 / fVar42;
            fVar29 = (float)(((uint)fVar51 & 0x7f800000) + 0x7800000);
            if ((uint)((int)fVar51 * 2) < 0x71000000) {
              fVar29 = 2.0;
            }
            fVar29 = fVar29 + (float)((uint)fVar51 & (uint)DAT_0014a020) * 5.192297e+33 *
                              7.70372e-34;
            uVar19 = (SUB42(fVar29,0) & 0xfff) + ((ushort)((uint)fVar29 >> 0xd) & 0x7c00);
            if (0xff000000 < (uint)((int)fVar51 * 2)) {
              uVar19 = 0x7e00;
            }
            pvVar15 = (void *)((long)dst + lVar26 * 0xd2);
            *(ushort *)((long)dst + lVar26 * 0xd2 + 0xd0) =
                 uVar19 | (ushort)((uint)fVar51 >> 0x10) & 0x8000;
            auVar43 = _DAT_0014e830;
            auVar49 = _DAT_0014e740;
            lVar25 = 0;
            uVar53 = (uint)DAT_0014e740;
            uVar54 = DAT_0014e740._4_4_;
            uVar55 = DAT_0014e740._8_4_;
            uVar56 = DAT_0014e740._12_4_;
            do {
              fVar29 = afStack_178[lVar25] * fVar42 + 12582912.0;
              fVar51 = afStack_178[lVar25 + 1] * fVar42 + 12582912.0;
              fVar38 = afStack_178[lVar25 + 2] * fVar42 + 12582912.0;
              fVar40 = afStack_178[lVar25 + 3] * fVar42 + 12582912.0;
              auVar44._0_4_ = -(uint)(0x40007f < ((uint)fVar29 & 0x7fff80));
              auVar44._4_4_ = -(uint)(0x40007f < ((uint)fVar51 & 0x7fff80));
              auVar44._8_4_ = -(uint)(0x40007f < ((uint)fVar38 & 0x7fff80));
              auVar44._12_4_ = -(uint)(0x40007f < ((uint)fVar40 & 0x7fff80));
              auVar45 = packssdw(auVar44,auVar44);
              auVar45 = packsswb(auVar45,auVar45);
              uVar33 = (uint)fVar29 & uVar53;
              uVar37 = (uint)fVar51 & uVar54;
              uVar39 = (uint)fVar38 & uVar55;
              uVar41 = (uint)fVar40 & uVar56;
              sVar5 = (short)uVar33;
              cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar33 - (0xff < sVar5);
              sVar5 = (short)(uVar33 >> 0x10);
              sVar32 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar33 >> 0x10) -
                                (0xff < sVar5),cVar1);
              sVar5 = (short)uVar37;
              cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar37 - (0xff < sVar5);
              sVar5 = (short)(uVar37 >> 0x10);
              uVar34 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar37 >> 0x10) -
                                (0xff < sVar5),CONCAT12(cVar2,sVar32));
              sVar5 = (short)uVar39;
              cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar39 - (0xff < sVar5);
              sVar5 = (short)(uVar39 >> 0x10);
              uVar35 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar39 >> 0x10) -
                                (0xff < sVar5),CONCAT14(cVar3,uVar34));
              sVar5 = (short)uVar41;
              cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar41 - (0xff < sVar5);
              sVar7 = (short)(uVar41 >> 0x10);
              sVar5 = (short)((uint)uVar34 >> 0x10);
              sVar6 = (short)((uint6)uVar35 >> 0x20);
              sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)(uVar41 >> 0x10) -
                                       (0xff < sVar7),CONCAT16(cVar4,uVar35)) >> 0x30);
              *(uint *)(lVar27 + lVar25) =
                   auVar45._0_4_ & auVar43._0_4_ |
                   ~auVar45._0_4_ &
                   CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                            CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                     CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5)
                                              ,(0 < sVar32) * (sVar32 < 0x100) * cVar1 -
                                               (0xff < sVar32))));
              auVar11 = _DAT_0014e890;
              auVar10 = _DAT_0014e880;
              auVar9 = _DAT_0014e870;
              auVar8 = _DAT_0014e860;
              auVar44 = _DAT_0014e790;
              auVar30 = _DAT_0014e780;
              auVar45 = _DAT_0014e5e0;
              lVar25 = lVar25 + 4;
            } while (lVar25 != 0x10);
            fVar29 = ggml_table_f32_f16[*(ushort *)((long)pvVar15 + 0xd0)];
            piVar28 = local_138;
            lVar25 = 0;
            pfVar16 = pfVar20;
            do {
              auVar36._0_4_ = (float)(int)*(char *)((long)pvVar15 + lVar25 + 0xc0) * fVar29;
              if ((auVar36._0_4_ != 0.0) || (NAN(auVar36._0_4_))) {
                auVar36._4_4_ = auVar36._0_4_;
                auVar36._8_4_ = auVar36._0_4_;
                auVar36._12_4_ = auVar36._0_4_;
                lVar23 = 0;
                do {
                  auVar43 = divps(*(undefined1 (*) [16])(pfVar16 + lVar23),auVar36);
                  fVar42 = auVar43._0_4_ + 12582912.0;
                  fVar51 = auVar43._4_4_ + 12582912.0;
                  auVar46._0_8_ = CONCAT44(fVar51,fVar42) & 0x7fffff007fffff;
                  auVar46._8_4_ = (uint)(auVar43._8_4_ + 12582912.0) & 0x7fffff;
                  auVar46._12_4_ = (uint)(auVar43._12_4_ + 12582912.0) & 0x7fffff;
                  auVar47._0_4_ = -(uint)((int)((uint)fVar42 & 0x7fffff) < (int)DAT_0014e800);
                  auVar47._4_4_ = -(uint)((int)((uint)fVar51 & 0x7fffff) < DAT_0014e800._4_4_);
                  auVar47._8_4_ = -(uint)((int)auVar46._8_4_ < DAT_0014e800._8_4_);
                  auVar47._12_4_ = -(uint)((int)auVar46._12_4_ < DAT_0014e800._12_4_);
                  auVar43 = ~auVar47 & _DAT_0014e800 | auVar46 & auVar47;
                  auVar52._0_4_ = -(uint)((int)DAT_0014e840 < auVar43._0_4_);
                  auVar52._4_4_ = -(uint)(DAT_0014e840._4_4_ < auVar43._4_4_);
                  auVar52._8_4_ = -(uint)(DAT_0014e840._8_4_ < auVar43._8_4_);
                  auVar52._12_4_ = -(uint)(DAT_0014e840._12_4_ < auVar43._12_4_);
                  auVar43 = (~auVar52 & _DAT_0014e840 | auVar43 & auVar52) & auVar49;
                  sVar5 = auVar43._0_2_;
                  cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar43[0] - (0xff < sVar5);
                  sVar5 = auVar43._2_2_;
                  sVar32 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar43[2] - (0xff < sVar5),
                                    cVar1);
                  sVar5 = auVar43._4_2_;
                  cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar43[4] - (0xff < sVar5);
                  sVar5 = auVar43._6_2_;
                  uVar34 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar43[6] - (0xff < sVar5),
                                    CONCAT12(cVar2,sVar32));
                  sVar5 = auVar43._8_2_;
                  cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar43[8] - (0xff < sVar5);
                  sVar5 = auVar43._10_2_;
                  uVar35 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar43[10] - (0xff < sVar5),
                                    CONCAT14(cVar3,uVar34));
                  sVar5 = auVar43._12_2_;
                  cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar43[0xc] - (0xff < sVar5);
                  sVar7 = auVar43._14_2_;
                  sVar5 = (short)((uint)uVar34 >> 0x10);
                  sVar6 = (short)((uint6)uVar35 >> 0x20);
                  sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar43[0xe] -
                                           (0xff < sVar7),CONCAT16(cVar4,uVar35)) >> 0x30);
                  *(uint *)(piVar28 + lVar23) =
                       CONCAT13(((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7)) + ' ',
                                CONCAT12(((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6)) +
                                         ' ',CONCAT11(((0 < sVar5) * (sVar5 < 0x100) * cVar2 -
                                                      (0xff < sVar5)) + ' ',
                                                      ((0 < sVar32) * (sVar32 < 0x100) * cVar1 -
                                                      (0xff < sVar32)) + ' ')));
                  lVar23 = lVar23 + 4;
                } while (lVar23 != 0x10);
              }
              lVar25 = lVar25 + 1;
              piVar28 = piVar28 + 0x10;
              pfVar16 = pfVar16 + 0x10;
            } while (lVar25 != 0x10);
            lVar25 = (long)pvVar15 + 0x80;
            lVar23 = 0;
            bVar12 = true;
            do {
              bVar18 = bVar12;
              lVar24 = 0;
              do {
                auVar49 = *(undefined1 (*) [16])(local_138 + lVar24 + lVar23);
                auVar43 = *(undefined1 (*) [16])(auStack_118 + lVar24 + lVar23);
                auVar36 = *(undefined1 (*) [16])(auStack_f8 + lVar24 + lVar23);
                auVar46 = *(undefined1 (*) [16])(local_d8 + lVar24 + lVar23);
                auVar52 = psllw(auVar36,4);
                *(undefined1 (*) [16])((long)pvVar15 + lVar24) =
                     ~auVar45 & auVar49 | auVar52 & auVar45;
                auVar52 = psllw(auVar46,4);
                *(undefined1 (*) [16])((long)pvVar15 + lVar24 + 0x20) =
                     ~auVar45 & auVar43 | auVar52 & auVar45;
                auVar48._0_2_ = auVar49._0_2_ >> 4;
                auVar48._2_2_ = auVar49._2_2_ >> 4;
                auVar48._4_2_ = auVar49._4_2_ >> 4;
                auVar48._6_2_ = auVar49._6_2_ >> 4;
                auVar48._8_2_ = auVar49._8_2_ >> 4;
                auVar48._10_2_ = auVar49._10_2_ >> 4;
                auVar48._12_2_ = auVar49._12_2_ >> 4;
                auVar48._14_2_ = auVar49._14_2_ >> 4;
                auVar49 = auVar48 & auVar8 ^ auVar9;
                auVar50[0] = auVar49[0] - auVar9[0];
                auVar50[1] = auVar49[1] - auVar9[1];
                auVar50[2] = auVar49[2] - auVar9[2];
                auVar50[3] = auVar49[3] - auVar9[3];
                auVar50[4] = auVar49[4] - auVar9[4];
                auVar50[5] = auVar49[5] - auVar9[5];
                auVar50[6] = auVar49[6] - auVar9[6];
                auVar50[7] = auVar49[7] - auVar9[7];
                auVar50[8] = auVar49[8] - auVar9[8];
                auVar50[9] = auVar49[9] - auVar9[9];
                auVar50[10] = auVar49[10] - auVar9[10];
                auVar50[0xb] = auVar49[0xb] - auVar9[0xb];
                auVar50[0xc] = auVar49[0xc] - auVar9[0xc];
                auVar50[0xd] = auVar49[0xd] - auVar9[0xd];
                auVar50[0xe] = auVar49[0xe] - auVar9[0xe];
                auVar50[0xf] = auVar49[0xf] - auVar9[0xf];
                auVar49._0_2_ = auVar43._0_2_ >> 2;
                auVar49._2_2_ = auVar43._2_2_ >> 2;
                auVar49._4_2_ = auVar43._4_2_ >> 2;
                auVar49._6_2_ = auVar43._6_2_ >> 2;
                auVar49._8_2_ = auVar43._8_2_ >> 2;
                auVar49._10_2_ = auVar43._10_2_ >> 2;
                auVar49._12_2_ = auVar43._12_2_ >> 2;
                auVar49._14_2_ = auVar43._14_2_ >> 2;
                auVar49 = auVar49 & auVar10 ^ auVar11;
                auVar31[0] = auVar49[0] - auVar11[0];
                auVar31[1] = auVar49[1] - auVar11[1];
                auVar31[2] = auVar49[2] - auVar11[2];
                auVar31[3] = auVar49[3] - auVar11[3];
                auVar31[4] = auVar49[4] - auVar11[4];
                auVar31[5] = auVar49[5] - auVar11[5];
                auVar31[6] = auVar49[6] - auVar11[6];
                auVar31[7] = auVar49[7] - auVar11[7];
                auVar31[8] = auVar49[8] - auVar11[8];
                auVar31[9] = auVar49[9] - auVar11[9];
                auVar31[10] = auVar49[10] - auVar11[10];
                auVar31[0xb] = auVar49[0xb] - auVar11[0xb];
                auVar31[0xc] = auVar49[0xc] - auVar11[0xc];
                auVar31[0xd] = auVar49[0xd] - auVar11[0xd];
                auVar31[0xe] = auVar49[0xe] - auVar11[0xe];
                auVar31[0xf] = auVar49[0xf] - auVar11[0xf];
                auVar49 = psllw(auVar46,2);
                *(undefined1 (*) [16])(lVar25 + lVar24) =
                     auVar49 & auVar44 | auVar36 & auVar45 | auVar50 | auVar31 & auVar30;
                lVar24 = lVar24 + 0x10;
              } while (lVar24 != 0x20);
              pvVar15 = (void *)((long)pvVar15 + 0x40);
              lVar25 = lVar25 + 0x20;
              lVar23 = 0x80;
              bVar12 = false;
            } while (bVar18);
          }
          else {
            memset((void *)(lVar26 * 0xd2 + (long)dst),0,0xd2);
          }
          pfVar20 = pfVar20 + 0x100;
          lVar26 = lVar26 + 1;
          pfVar21 = pfVar21 + 0x100;
          lVar27 = lVar27 + 0xd2;
        } while (lVar26 != lVar14 >> 8);
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar13);
      lVar17 = lVar17 + 1;
      local_1e8 = local_1e8 + sVar13;
    } while (lVar17 != nrow);
  }
  return sVar13 * nrow;
}

Assistant:

size_t quantize_q6_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q6_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q6_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q6_K_impl(src, (block_q6_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}